

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,ExpressionList *expression_list)

{
  pointer ppEVar1;
  ostream *poVar2;
  pointer ppEVar3;
  
  PrintTabs(this);
  poVar2 = std::operator<<((ostream *)&this->stream_,"ExpressionList: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  this->num_tabs_ = this->num_tabs_ + 1;
  ppEVar1 = (expression_list->expressions_).
            super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar3 = (expression_list->expressions_).
                 super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar3 != ppEVar1; ppEVar3 = ppEVar3 + 1) {
    (*((*ppEVar3)->super_BaseElement)._vptr_BaseElement[2])(*ppEVar3,this);
  }
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(ExpressionList *expression_list) {
  PrintTabs();
  stream_ << "ExpressionList: " << std::endl;
  ++num_tabs_;
  for (auto expression: expression_list->expressions_) {
    expression->Accept(this);
  }
  --num_tabs_;
}